

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshio.cpp
# Opt level: O2

CornerData<Vector2> *
geometrycentral::surface::packToParam
          (CornerData<Vector2> *__return_storage_ptr__,SurfaceMesh *mesh,VertexData<double> *vals)

{
  Vector2 *pVVar1;
  RangeIteratorBase<geometrycentral::surface::CornerRangeF> __begin2;
  RangeIteratorBase<geometrycentral::surface::CornerRangeF> __end2;
  RangeIteratorBase<geometrycentral::surface::CornerRangeF> local_60;
  RangeIteratorBase<geometrycentral::surface::CornerRangeF> local_48;
  RangeSetBase<geometrycentral::surface::CornerRangeF> local_30;
  
  MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>::MeshData
            (__return_storage_ptr__,mesh);
  local_30.iEnd = mesh->nHalfedgesFillCount;
  local_30.iStart = 0;
  local_30.mesh = mesh;
  RangeSetBase<geometrycentral::surface::CornerRangeF>::begin(&local_60,&local_30);
  RangeSetBase<geometrycentral::surface::CornerRangeF>::end(&local_48,&local_30);
  while (local_60.iCurr != local_48.iCurr) {
    pVVar1 = (__return_storage_ptr__->data).
             super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector2,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    pVVar1[local_60.iCurr].x =
         (vals->data).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_data[((local_60.mesh)->heVertexArr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[local_60.iCurr]];
    pVVar1[local_60.iCurr].y = 0.0;
    RangeIteratorBase<geometrycentral::surface::CornerRangeF>::operator++(&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

CornerData<Vector2> packToParam(SurfaceMesh& mesh, VertexData<double>& vals) {
  CornerData<Vector2> out(mesh);
  for (Corner c : mesh.corners()) {
    Vertex v = c.vertex();
    out[c] = Vector2{vals[v], 0.};
  }
  return out;
}